

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O3

int __thiscall embree::LineCommentFilter::next(LineCommentFilter *this)

{
  Stream<int> *this_00;
  int iVar1;
  int *piVar2;
  size_t n;
  
  if ((this->lineComment)._M_string_length != 0) {
    n = 0;
    do {
      piVar2 = Stream<int>::peek((this->cin).ptr);
      this_00 = (this->cin).ptr;
      if (*piVar2 != (int)(this->lineComment)._M_dataplus._M_p[n]) {
        Stream<int>::unget(this_00,n);
        goto LAB_00916158;
      }
      Stream<int>::get(this_00);
      n = n + 1;
    } while (n < (this->lineComment)._M_string_length);
  }
  while ((piVar2 = Stream<int>::peek((this->cin).ptr), *piVar2 != 10 &&
         (piVar2 = Stream<int>::peek((this->cin).ptr), *piVar2 != -1))) {
    Stream<int>::get((this->cin).ptr);
  }
LAB_00916158:
  iVar1 = Stream<int>::get((this->cin).ptr);
  return iVar1;
}

Assistant:

int next()
    {
      /* look if the line comment starts here */
      for (size_t j=0; j<lineComment.size(); j++) {
        if (cin->peek() != lineComment[j]) { cin->unget(j); goto not_found; }
        cin->get();
      }
      /* eat all characters until the end of the line (or file) */
      while (cin->peek() != '\n' && cin->peek() != EOF) cin->get();

    not_found:
      return cin->get();
    }